

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::on_dynamic_width<fmt::v6::basic_string_view<char>>
          (specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
           *this,basic_string_view<char> arg_id)

{
  unsigned_long_long uVar1;
  error_handler local_61;
  width_checker<fmt::v6::internal::error_handler> local_60;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::arg
            ((format_arg *)&local_58.string,
             *(basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>
               **)(this + 0x10),arg_id);
  local_38.long_long_value = local_58.long_long_value;
  local_38.string.size = local_58.string.size;
  local_28 = local_48;
  uStack_20 = uStack_40;
  local_60.handler_ = &local_61;
  uVar1 = visit_format_arg<fmt::v6::internal::width_checker<fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                    (&local_60,
                     (basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                      *)&local_38.string);
  if ((uVar1 & 0xffffffff80000000) == 0) {
    **(undefined4 **)this = (int)uVar1;
    return;
  }
  error_handler::on_error(&local_61,"number is too big");
}

Assistant:

FMT_CONSTEXPR void on_dynamic_width(Id arg_id) {
    this->specs_.width = get_dynamic_spec<width_checker>(
        get_arg(arg_id), context_.error_handler());
  }